

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::writeToBinary(Binasc *this,ostream *out,istream *input)

{
  int iVar1;
  int iVar2;
  string inputLine;
  
  inputLine._M_dataplus._M_p = (pointer)&inputLine.field_2;
  inputLine._M_string_length = 0;
  inputLine.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&inputLine);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(input,(string *)&inputLine,'\n');
  iVar2 = 1;
  do {
    if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
      iVar2 = 1;
LAB_00124d0a:
      std::__cxx11::string::~string((string *)&inputLine);
      return iVar2;
    }
    iVar1 = processLine(this,out,&inputLine,iVar2);
    if (iVar1 == 0) {
      iVar2 = 0;
      goto LAB_00124d0a;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>(input,(string *)&inputLine,'\n');
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

int Binasc::writeToBinary(std::ostream& out, std::istream& input) {
	std::string inputLine;
	inputLine.reserve(8196);
	int  lineNum = 0;              // current line number
	getline(input, inputLine, '\n');
	lineNum++;
	while (!input.eof()) {
		int status = processLine(out, inputLine, lineNum);
		if (!status) {
			return 0;
		}
		getline(input, inputLine, '\n');
		lineNum++;
	}
	return 1;
}